

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_features.pb.cc
# Opt level: O1

uint8_t * __thiscall
pb::CppFeatures::_InternalSerialize(CppFeatures *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  anon_union_16_1_493b367e_for_CppFeatures_12 aVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  
  aVar2 = this->field_0;
  if (((undefined1  [16])aVar2 & (undefined1  [16])0x2) != (undefined1  [16])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.legacy_closed_enum_;
    *target = '\b';
    target[1] = bVar1;
    target = target + 2;
  }
  if (((undefined1  [16])aVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = (ulong)(this->field_0)._impl_.string_type_;
    pbVar4 = target + 1;
    *target = 0x10;
    uVar6 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar4 = (byte)uVar6 | 0x80;
        uVar5 = uVar6 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar5;
      } while (bVar1);
    }
    *pbVar4 = (byte)uVar5;
    target = pbVar4 + 1;
  }
  if (((undefined1  [16])aVar2 & (undefined1  [16])0x4) != (undefined1  [16])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.enum_name_uses_string_view_;
    *target = 0x18;
    target[1] = bVar1;
    target = target + 2;
  }
  uVar6 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar6 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar3;
  }
  return target;
}

Assistant:

::uint8_t* CppFeatures::_InternalSerialize(
            ::uint8_t* target,
            ::google::protobuf::io::EpsCopyOutputStream* stream) const {
          const CppFeatures& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(serialize_to_array_start:pb.CppFeatures)
          ::uint32_t cached_has_bits = 0;
          (void)cached_has_bits;

          cached_has_bits = this_._impl_._has_bits_[0];
          // optional bool legacy_closed_enum = 1 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_FILE, edition_defaults = {
          if (cached_has_bits & 0x00000002u) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteBoolToArray(
                1, this_._internal_legacy_closed_enum(), target);
          }

          // optional .pb.CppFeatures.StringType string_type = 2 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_FILE, edition_defaults = {
          if (cached_has_bits & 0x00000001u) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteEnumToArray(
                2, this_._internal_string_type(), target);
          }

          // optional bool enum_name_uses_string_view = 3 [retention = RETENTION_SOURCE, targets = TARGET_TYPE_ENUM, targets = TARGET_TYPE_FILE, edition_defaults = {
          if (cached_has_bits & 0x00000004u) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteBoolToArray(
                3, this_._internal_enum_name_uses_string_view(), target);
          }

          if (PROTOBUF_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
            target =
                ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
                    this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
          }
          // @@protoc_insertion_point(serialize_to_array_end:pb.CppFeatures)
          return target;
        }